

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.h
# Opt level: O0

void __thiscall
Assimp::FBX::Node::
AddProperties<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,long>
          (Node *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *more,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *more_1,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *more_2,long more_3)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  long local_38;
  long more_local_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *more_local_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *more_local_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *more_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value_local;
  Node *this_local;
  
  local_38 = more_3;
  more_local_3 = (long)more_2;
  more_local_2 = more_1;
  more_local_1 = more;
  more_local = value;
  value_local = &this->name;
  std::vector<Assimp::FBX::FBXExportProperty,std::allocator<Assimp::FBX::FBXExportProperty>>::
  emplace_back<std::__cxx11::string&>
            ((vector<Assimp::FBX::FBXExportProperty,std::allocator<Assimp::FBX::FBXExportProperty>>
              *)&this->properties,value);
  std::__cxx11::string::string((string *)&local_58,(string *)more);
  std::__cxx11::string::string((string *)&local_78,(string *)more_1);
  std::__cxx11::string::string((string *)&local_a8,(string *)more_2);
  AddProperties<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,long>
            (this,&local_58,&local_78,&local_a8,local_38);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  return;
}

Assistant:

void AddProperties(T value, More... more) {
        properties.emplace_back(value);
        AddProperties(more...);
    }